

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_add_bufferf(Curl_send_buffer *in,char *fmt,...)

{
  char in_AL;
  char *__s;
  size_t size;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  CURLcode local_4c;
  undefined1 local_48 [4];
  CURLcode result;
  va_list ap;
  char *s;
  char *fmt_local;
  Curl_send_buffer *in_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_108;
  ap[0]._0_8_ = &stack0x00000008;
  result = CURLE_UNKNOWN_OPTION;
  local_48 = (undefined1  [4])0x10;
  local_f8 = in_RDX;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  __s = curl_mvaprintf(fmt,(__va_list_tag *)local_48);
  if (__s == (char *)0x0) {
    (*Curl_cfree)(in->buffer);
    (*Curl_cfree)(in);
    in_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    size = strlen(__s);
    local_4c = Curl_add_buffer(in,__s,size);
    (*Curl_cfree)(__s);
    in_local._4_4_ = local_4c;
  }
  return in_local._4_4_;
}

Assistant:

CURLcode Curl_add_bufferf(Curl_send_buffer *in, const char *fmt, ...)
{
  char *s;
  va_list ap;
  va_start(ap, fmt);
  s = vaprintf(fmt, ap); /* this allocs a new string to append */
  va_end(ap);

  if(s) {
    CURLcode result = Curl_add_buffer(in, s, strlen(s));
    free(s);
    return result;
  }
  /* If we failed, we cleanup the whole buffer and return error */
  free(in->buffer);
  free(in);
  return CURLE_OUT_OF_MEMORY;
}